

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

void __thiscall JUnitTestOutput::writeTestSuiteSummary(JUnitTestOutput *this)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  char *pcVar5;
  SimpleString *this_00;
  ulong uVar6;
  long *in_RDI;
  SimpleString buf;
  undefined4 in_stack_ffffffffffffff7c;
  undefined1 local_28 [16];
  char local_18 [24];
  
  uVar1 = *(uint *)(in_RDI[4] + 8);
  pcVar5 = SimpleString::asCharString((SimpleString *)0x177280);
  uVar2 = *(uint *)in_RDI[4];
  uVar3 = *(ulong *)((uint *)in_RDI[4] + 8);
  uVar6 = uVar3 / 1000;
  iVar4 = (int)uVar3 + (int)uVar6 * -1000;
  this_00 = (SimpleString *)(*GetPlatformSpecificTimeString)();
  StringFromFormat(local_18,
                   "<testsuite errors=\"0\" failures=\"%d\" hostname=\"localhost\" name=\"%s\" tests=\"%d\" time=\"%d.%03d\" timestamp=\"%s\">\n"
                   ,(ulong)uVar1,pcVar5,(ulong)uVar2,uVar6 & 0xffffffff);
  SimpleString::asCharString((SimpleString *)0x17731d);
  SimpleString::SimpleString(this_00,(char *)CONCAT44(in_stack_ffffffffffffff7c,iVar4));
  (**(code **)(*in_RDI + 0xd0))(in_RDI,local_28);
  SimpleString::~SimpleString((SimpleString *)0x177357);
  SimpleString::~SimpleString((SimpleString *)0x177361);
  return;
}

Assistant:

void JUnitTestOutput::writeTestSuiteSummary()
{
    SimpleString
            buf =
                    StringFromFormat(
                            "<testsuite errors=\"0\" failures=\"%d\" hostname=\"localhost\" name=\"%s\" tests=\"%d\" time=\"%d.%03d\" timestamp=\"%s\">\n",
                            (int)impl_->results_.failureCount_,
                            impl_->results_.group_.asCharString(),
                            (int) impl_->results_.testCount_,
                            (int) (impl_->results_.groupExecTime_ / 1000), (int) (impl_->results_.groupExecTime_ % 1000),
                            GetPlatformSpecificTimeString());
    writeToFile(buf.asCharString());
}